

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O1

bool __thiscall wasm::ExecutionResults::operator==(ExecutionResults *this,ExecutionResults *other)

{
  _Rb_tree_node_base *__k;
  __index_type _Var1;
  size_t sVar2;
  bool bVar3;
  iterator iVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  SmallVector<wasm::Literal,_1UL> *other_00;
  SmallVector<wasm::Literal,_1UL> *other_01;
  _Base_ptr p_Var7;
  long lVar8;
  undefined8 in_RCX;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  pointer pLVar12;
  ulong uVar13;
  bool bVar14;
  Name name;
  Name name_00;
  Literal local_100;
  Literal local_e8;
  SmallVector<wasm::Literal,_1UL> local_d0;
  SmallVector<wasm::Literal,_1UL> local_98;
  _Rb_tree_node_base *local_60;
  ExecutionResults *local_58;
  _Base_ptr local_50;
  array<wasm::Literal,_1UL> *local_48;
  ExecutionResults *local_40;
  byte local_32;
  char local_31;
  
  if ((this->ignore == false) && (other->ignore != true)) {
    p_Var7 = (other->results)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60 = &(other->results)._M_t._M_impl.super__Rb_tree_header._M_header;
    pcVar9 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),p_Var7 == local_60);
    local_40 = this;
    if (p_Var7 != local_60) {
      local_50 = &(this->results)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_48 = &local_d0.fixed;
      local_58 = other;
      do {
        local_32 = (byte)pcVar9;
        __k = p_Var7 + 1;
        iVar4 = std::
                _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                        *)this,(key_type *)__k);
        if (iVar4._M_node == local_50) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[fuzz-exec] missing ",0x14);
          name_00.super_IString.str._M_str = pcVar9;
          name_00.super_IString.str._M_len = (size_t)p_Var7[1]._M_parent;
          poVar5 = wasm::operator<<((wasm *)&std::cout,*(ostream **)(p_Var7 + 1),name_00);
          local_31 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_31,1);
LAB_001d13ad:
          if ((local_32 & 1) == 0) goto LAB_001d149e;
          break;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[fuzz-exec] comparing ",0x16);
        name.super_IString.str._M_str = pcVar9;
        name.super_IString.str._M_len = (size_t)p_Var7[1]._M_parent;
        poVar5 = wasm::operator<<((wasm *)&std::cout,*(ostream **)(p_Var7 + 1),name);
        local_31 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_31,1);
        pmVar6 = std::
                 map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                 ::operator[](&this->results,(key_type *)__k);
        _Var1 = (pmVar6->
                super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                ).
                super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                ._M_index;
        pmVar6 = std::
                 map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                 ::operator[](&other->results,(key_type *)__k);
        if (_Var1 != (pmVar6->
                     super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     ).
                     super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     ._M_index) goto LAB_001d13ad;
        other_00 = (SmallVector<wasm::Literal,_1UL> *)
                   std::
                   map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                   ::operator[](&this->results,(key_type *)__k);
        sVar2 = other_00[1].usedFixed;
        other_01 = (SmallVector<wasm::Literal,_1UL> *)
                   std::
                   map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                   ::operator[](&other->results,(key_type *)__k);
        bVar3 = true;
        if ((char)sVar2 == '\0' && (char)other_01[1].usedFixed == '\0') {
          SmallVector<wasm::Literal,_1UL>::SmallVector(&local_d0,other_00);
          SmallVector<wasm::Literal,_1UL>::SmallVector(&local_98,other_01);
          bVar3 = areEqual(local_40,(Literals *)&local_d0,(Literals *)&local_98);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_98.flexible);
          ::wasm::Literal::~Literal(local_98.fixed._M_elems);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_d0.flexible);
          ::wasm::Literal::~Literal(local_d0.fixed._M_elems);
        }
        this = local_40;
        other = local_58;
        if (bVar3 == false) goto LAB_001d13ad;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        pcVar9 = (char *)CONCAT71((int7)((ulong)pcVar9 >> 8),p_Var7 == local_60);
      } while (p_Var7 != local_60);
    }
    lVar8 = (long)(this->loggings).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->loggings).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (lVar8 == (long)(other->loggings).
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(other->loggings).
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_start) {
      pLVar12 = (this->loggings).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar3 = (this->loggings).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
              _M_impl.super__Vector_impl_data._M_finish == pLVar12;
      uVar10 = CONCAT71((int7)((ulong)lVar8 >> 8),bVar3);
      if (!bVar3) {
        uVar11 = 0;
        uVar13 = 1;
        do {
          local_50 = (_Base_ptr)CONCAT44(local_50._4_4_,(int)uVar10);
          ::wasm::Literal::Literal(&local_100,pLVar12 + uVar11);
          ::wasm::Literal::Literal
                    (&local_e8,
                     (other->loggings).
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar11);
          bVar3 = areEqual(local_40,&local_100,&local_e8);
          ::wasm::Literal::~Literal(&local_e8);
          ::wasm::Literal::~Literal(&local_100);
          uVar10 = (ulong)local_50 & 0xffffffff;
          if (!bVar3) break;
          pLVar12 = (local_40->loggings).
                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar10 = ((long)(local_40->loggings).
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pLVar12 >> 3) *
                   -0x5555555555555555;
          bVar3 = uVar10 < uVar13;
          bVar14 = uVar10 - uVar13 == 0;
          uVar10 = CONCAT71(0xaaaaaaaaaaaaaa,bVar3 || bVar14);
          uVar11 = uVar13;
          uVar13 = (ulong)((int)uVar13 + 1);
        } while (!bVar3 && !bVar14);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"logging counts not identical!\n",0x1e);
LAB_001d149e:
      uVar10 = 0;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ignoring comparison of ExecutionResults!\n",0x29);
    uVar10 = 1;
  }
  return (bool)((byte)uVar10 & 1);
}

Assistant:

bool operator==(ExecutionResults& other) {
    if (ignore || other.ignore) {
      std::cout << "ignoring comparison of ExecutionResults!\n";
      return true;
    }
    for (auto& [name, _] : other.results) {
      if (results.find(name) == results.end()) {
        std::cout << "[fuzz-exec] missing " << name << '\n';
        return false;
      }
      std::cout << "[fuzz-exec] comparing " << name << '\n';
      if (results[name].index() != other.results[name].index()) {
        return false;
      }
      auto* values = std::get_if<Literals>(&results[name]);
      auto* otherValues = std::get_if<Literals>(&other.results[name]);
      if (values && otherValues && !areEqual(*values, *otherValues)) {
        return false;
      }
    }
    if (loggings.size() != other.loggings.size()) {
      std::cout << "logging counts not identical!\n";
      return false;
    }
    for (Index i = 0; i < loggings.size(); i++) {
      if (!areEqual(loggings[i], other.loggings[i])) {
        return false;
      }
    }
    return true;
  }